

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_billboard_rec
               (rf_camera3d camera,rf_texture2d texture,rf_rec source_rec,rf_vec3 center,float size,
               rf_color tint)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  float y;
  float y_00;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_118;
  float fStack_114;
  float local_f8;
  float fStack_f4;
  float local_e8;
  float fStack_e4;
  rf_mat mat_view;
  
  fVar5 = center.z;
  rf_mat_look_at(&mat_view,camera.position,camera.target,camera.up);
  _Var1 = rf_gfx_check_buffer_limit(4);
  if (_Var1) {
    rf_gfx_draw();
  }
  fVar2 = size * 0.5;
  local_e8 = source_rec.width;
  fStack_e4 = source_rec.height;
  fVar8 = ((size * fStack_e4) / local_e8) * 0.5;
  fVar3 = fVar8 * 0.0;
  fVar4 = fVar3 + mat_view.m8 * fVar2;
  local_f8 = center.x;
  fStack_f4 = center.y;
  fVar6 = fVar8 + mat_view.m4 * fVar2;
  fVar7 = fVar3 + fVar2 * mat_view.m0;
  fVar8 = mat_view.m4 * fVar2 - fVar8;
  fVar9 = mat_view.m8 * fVar2 - fVar3;
  fVar3 = fVar2 * mat_view.m0 - fVar3;
  rf_gfx_enable_texture(texture.id);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(tint.r,tint.g,tint.b,tint.a);
  local_118 = source_rec.x;
  fStack_114 = source_rec.y;
  fVar2 = local_118 / (float)texture.width;
  y = fStack_114 / (float)texture.height;
  rf_gfx_tex_coord2f(fVar2,y);
  rf_gfx_vertex3f(local_f8 - fVar3,fStack_f4 - fVar8,fVar5 - fVar9);
  y_00 = (fStack_114 + fStack_e4) / (float)texture.height;
  rf_gfx_tex_coord2f(fVar2,y_00);
  rf_gfx_vertex3f(local_f8 - fVar7,fStack_f4 - fVar6,fVar5 - fVar4);
  fVar2 = (local_118 + local_e8) / (float)texture.width;
  rf_gfx_tex_coord2f(fVar2,y_00);
  rf_gfx_vertex3f(local_f8 + fVar3,fStack_f4 + fVar8,fVar9 + fVar5);
  rf_gfx_tex_coord2f(fVar2,y);
  rf_gfx_vertex3f(fVar7 + local_f8,fVar6 + fStack_f4,fVar4 + fVar5);
  rf_gfx_end();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_billboard_rec(rf_camera3d camera, rf_texture2d texture, rf_rec source_rec, rf_vec3 center, float size, rf_color tint)
{
    // NOTE: Billboard size will maintain source_rec aspect ratio, size will represent billboard width
    rf_vec2 size_ratio = {size, size * (float)source_rec.height / source_rec.width };

    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);

    rf_vec3 right = {mat_view.m0, mat_view.m4, mat_view.m8 };
    //rf_vec3 up = { mat_view.m1, mat_view.m5, mat_view.m9 };

    // NOTE: Billboard locked on axis-Y
    rf_vec3 up = {0.0f, 1.0f, 0.0f };
    /*
        a-------b
        |       |
        |   *   |
        |       |
        d-------c
    */
    right = rf_vec3_scale(right, size_ratio.x / 2);
    up = rf_vec3_scale(up, size_ratio.y / 2);

    rf_vec3 p1 = rf_vec3_add(right, up);
    rf_vec3 p2 = rf_vec3_sub(right, up);

    rf_vec3 a = rf_vec3_sub(center, p2);
    rf_vec3 b = rf_vec3_add(center, p1);
    rf_vec3 c = rf_vec3_add(center, p2);
    rf_vec3 d = rf_vec3_sub(center, p1);

    if (rf_gfx_check_buffer_limit(4)) rf_gfx_draw();

    rf_gfx_enable_texture(texture.id);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(tint.r, tint.g, tint.b, tint.a);

    // Bottom-left corner for texture and quad
    rf_gfx_tex_coord2f((float)source_rec.x/texture.width, (float)source_rec.y/texture.height);
    rf_gfx_vertex3f(a.x, a.y, a.z);

    // Top-left corner for texture and quad
    rf_gfx_tex_coord2f((float)source_rec.x/texture.width, (float)(source_rec.y + source_rec.height)/texture.height);
    rf_gfx_vertex3f(d.x, d.y, d.z);

    // Top-right corner for texture and quad
    rf_gfx_tex_coord2f((float)(source_rec.x + source_rec.width)/texture.width, (float)(source_rec.y + source_rec.height)/texture.height);
    rf_gfx_vertex3f(c.x, c.y, c.z);

    // Bottom-right corner for texture and quad
    rf_gfx_tex_coord2f((float)(source_rec.x + source_rec.width)/texture.width, (float)source_rec.y/texture.height);
    rf_gfx_vertex3f(b.x, b.y, b.z);
    rf_gfx_end();

    rf_gfx_disable_texture();
}